

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join.c
# Opt level: O0

int do_send(uv_udp_send_t *send_req)

{
  int iVar1;
  uv_buf_t uVar2;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_44 [8];
  sockaddr_in6 addr;
  uv_buf_t buf;
  uv_udp_send_t *send_req_local;
  
  uVar2 = uv_buf_init("PING",4);
  eval_a = (int64_t)uVar2.base;
  addr._20_8_ = eval_a;
  iVar1 = uv_ip6_addr("ff02::1",0x23a3,(sockaddr_in6 *)local_44);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join6.c"
            ,0x5d,"uv_ip6_addr(\"ff02::1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_send(send_req,&client,(uv_buf_t *)((long)&addr.sin6_addr.__in6_u + 0xc),1,
                      (sockaddr *)local_44,sv_send_cb);
  return iVar1;
}

Assistant:

static int do_send(uv_udp_send_t* send_req) {
  uv_buf_t buf;
  struct sockaddr_in addr;
  
  buf = uv_buf_init("PING", 4);

  ASSERT_OK(uv_ip4_addr(MULTICAST_ADDR, TEST_PORT, &addr));

  /* client sends "PING" */
  return uv_udp_send(send_req,
                     &client,
                     &buf,
                     1,
                     (const struct sockaddr*) &addr,
                     sv_send_cb);
}